

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

Path * __thiscall
tinyusdz::Path::append_element(Path *__return_storage_ptr__,Path *this,string *elem)

{
  char cVar1;
  bool bVar2;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  variant;
  
  if (elem->_M_string_length != 0) {
    bVar2 = is_variantElementName(elem);
    if (bVar2) {
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
      array(&variant);
      bVar2 = tokenize_variantElement(elem,&variant);
      if (bVar2) {
        std::__cxx11::string::_M_assign((string *)&this->_variant_part);
        std::__cxx11::string::_M_assign((string *)&this->_variant_selection_part);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::_M_assign((string *)&this->_element);
        Path(__return_storage_ptr__,this);
      }
      else {
        this->_valid = false;
      }
      std::
      array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>::
      ~array(&variant);
      if (bVar2) {
        return __return_storage_ptr__;
      }
    }
    cVar1 = *(elem->_M_dataplus)._M_p;
    if ((cVar1 != '.') && (cVar1 != '[')) {
      if (((this->_prim_part)._M_string_length == 1) &&
         (*(this->_prim_part)._M_dataplus._M_p == '/')) {
        std::__cxx11::string::append((string *)this);
      }
      else {
        std::operator+(variant._M_elems,'/',elem);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::_M_dispose();
      }
      std::__cxx11::string::_M_assign((string *)&this->_element);
      goto LAB_00125ac9;
    }
  }
  this->_valid = false;
LAB_00125ac9:
  Path(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

Path Path::append_element(const std::string &elem) {
  Path &p = (*this);

  if (elem.empty()) {
    p._valid = false;
    return p;
  }

  // {variant=value}
  if (is_variantElementName(elem)) {
    std::array<std::string, 2> variant;
    if (tokenize_variantElement(elem, &variant)) {
      _variant_part = variant[0];
      _variant_selection_part = variant[0];
      _prim_part += elem;
      _element = elem;
      return p;
    } else {
      p._valid = false;
    }
  }

  if (elem[0] == '[') {
    // relational attrib are not supported
    p._valid = false;
    return p;
  } else if (elem[0] == '.') {
    // Relative path
    // For a while, make this valid.
    p._valid = false;
    return p;
  } else {
    // std::cout << "elem " << elem << "\n";
    if ((p._prim_part.size() == 1) && (p._prim_part[0] == '/')) {
      p._prim_part += elem;
    } else {
      // TODO: Validate element name.
      p._prim_part += '/' + elem;
    }

    // Also store raw element name
    p._element = elem;

    return p;
  }
}